

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O1

void __thiscall SRBRoot::compactStringsV2(SRBRoot *this,UHashtable *stringSet,UErrorCode *errorCode)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  StringResource *pSVar5;
  SResource *pSVar6;
  byte bVar7;
  UBool UVar8;
  uint uVar9;
  int iVar10;
  void *array;
  UHashElement *pUVar11;
  StringBaseResource *this_00;
  int32_t iVar12;
  UChar *srcChars;
  long *plVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  int32_t pos;
  int32_t local_3c;
  UnicodeString *local_38;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar9 = uhash_count_63(stringSet);
  uVar19 = 0xffffffffffffffff;
  if (-1 < (int)uVar9) {
    uVar19 = (long)(int)uVar9 << 3;
  }
  array = operator_new__(uVar19);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar19 = (ulong)uVar9;
    local_3c = -1;
    if (0 < (int)uVar9) {
      uVar15 = 0;
      do {
        pUVar11 = uhash_nextElement_63(stringSet,&local_3c);
        *(UHashTok *)((long)array + uVar15 * 8) = pUVar11->key;
        uVar15 = uVar15 + 1;
      } while (uVar19 != uVar15);
    }
    uprv_sortArray_63(array,uVar9,8,compareStringSuffixes,(void *)0x0,'\0',errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (0 < (int)uVar9) {
        uVar16 = 0;
        do {
          lVar22 = (long)(int)uVar16;
          lVar3 = *(long *)((long)array + lVar22 * 8);
          if (*(short *)(lVar3 + 0x40) < 0) {
            iVar10 = *(int *)(lVar3 + 0x44);
          }
          else {
            iVar10 = (int)*(short *)(lVar3 + 0x40) >> 5;
          }
          *(int *)(lVar3 + 0x88) =
               (*(int *)(lVar3 + 0x84) + -1) * (iVar10 + *(char *)(lVar3 + 0x8c) + 1);
          uVar21 = uVar16 + 1;
          if ((int)(uVar16 + 1) < (int)uVar9) {
            uVar21 = uVar9;
          }
          while (lVar22 = lVar22 + 1, lVar22 < (long)uVar19) {
            lVar4 = *(long *)((long)array + lVar22 * 8);
            sVar1 = *(short *)(lVar3 + 0x40);
            uVar2 = *(ushort *)(lVar4 + 0x40);
            if ((uVar2 & 1) == 0) {
              if ((short)uVar2 < 0) {
                iVar10 = *(int *)(lVar4 + 0x44);
              }
              else {
                iVar10 = (int)(short)uVar2 >> 5;
              }
              iVar18 = iVar10;
              if (-1 < iVar10) {
                iVar18 = 0;
              }
              iVar17 = iVar10 - iVar18;
              if (iVar10 <= iVar10 - iVar18) {
                iVar17 = iVar10;
              }
              if (iVar10 < 0) {
                iVar17 = 0;
              }
              if (sVar1 < 0) {
                iVar20 = *(int *)(lVar3 + 0x44);
              }
              else {
                iVar20 = (int)sVar1 >> 5;
              }
              if ((uVar2 & 2) == 0) {
                srcChars = *(UChar **)(lVar4 + 0x50);
              }
              else {
                srcChars = (UChar *)(lVar4 + 0x42);
              }
              bVar7 = icu_63::UnicodeString::doCompare
                                ((UnicodeString *)(lVar3 + 0x38),iVar20 - iVar10,iVar10,srcChars,
                                 iVar18,iVar17);
            }
            else {
              bVar7 = ~(byte)sVar1 & 1;
            }
            if (bVar7 != 0) {
              uVar21 = uVar16 + 1;
              break;
            }
            if (*(short *)(lVar3 + 0x40) < 0) {
              iVar10 = *(int *)(lVar3 + 0x44);
            }
            else {
              iVar10 = (int)*(short *)(lVar3 + 0x40) >> 5;
            }
            if (*(short *)(lVar4 + 0x40) < 0) {
              iVar18 = *(int *)(lVar4 + 0x44);
            }
            else {
              iVar18 = (int)*(short *)(lVar4 + 0x40) >> 5;
            }
            if (iVar10 == iVar18) {
              __assert_fail("res->length() != suffixRes->length()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                            ,0x621,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
            }
            if ((*(char *)(lVar4 + 9) == '\0') && (*(char *)(lVar4 + 0x8c) == '\0')) {
              *(long *)(lVar4 + 0x78) = lVar3;
              if (*(short *)(lVar3 + 0x40) < 0) {
                iVar10 = *(int *)(lVar3 + 0x44);
              }
              else {
                iVar10 = (int)*(short *)(lVar3 + 0x40) >> 5;
              }
              *(int *)(lVar4 + 0x80) = iVar10 - iVar18;
              if (*(char *)(lVar3 + 9) != '\0') {
                uVar14 = (iVar10 - iVar18) + *(int *)(lVar3 + 0xc) + (int)*(char *)(lVar3 + 0x8c);
                *(uint *)(lVar4 + 0xc) = uVar14;
                uVar14 = uVar14 & 0xfffffff;
                if (this->fPoolStringIndexLimit <= (int)uVar14) {
                  this->fPoolStringIndexLimit = uVar14 + 1;
                }
                *(undefined1 *)(lVar4 + 9) = 1;
              }
              if (*(short *)(lVar4 + 0x40) < 0) {
                iVar10 = *(int *)(lVar4 + 0x44);
              }
              else {
                iVar10 = (int)*(short *)(lVar4 + 0x40) >> 5;
              }
              *(int *)(lVar3 + 0x88) =
                   *(int *)(lVar3 + 0x88) + (iVar10 + 1) * *(int *)(lVar4 + 0x84);
            }
            uVar16 = uVar16 + 1;
          }
          uVar16 = uVar21;
        } while ((int)uVar16 < (int)uVar9);
      }
      uprv_sortArray_63(array,uVar9,8,compareStringLengths,(void *)0x0,'\0',errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (this->fIsPoolBundle == '\0') {
          if (this->fUsePoolBundle->fStringIndexLimit < this->fPoolStringIndexLimit) {
            __assert_fail("fPoolStringIndexLimit <= fUsePoolBundle->fStringIndexLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                          ,0x66a,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
          }
          if ((int)uVar9 < 1) {
            uVar15 = 0;
          }
          else {
            uVar15 = 0;
            do {
              pSVar5 = *(StringResource **)((long)array + uVar15 * 8);
              if (pSVar5->fSame != (StringResource *)0x0) goto LAB_00215572;
              if ((pSVar5->super_StringBaseResource).super_SResource.fWritten == '\0') {
                sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
                if (sVar1 < 0) {
                  iVar10 = (this->f16BitUnits).fUnion.fFields.fLength;
                }
                else {
                  iVar10 = (int)sVar1 >> 5;
                }
                if (this->fLocalStringIndexLimit <= iVar10) {
                  this->fLocalStringIndexLimit = iVar10 + 1;
                }
                StringResource::writeUTF16v2(pSVar5,this->fPoolStringIndexLimit,&this->f16BitUnits);
              }
              uVar15 = uVar15 + 1;
            } while (uVar19 != uVar15);
            uVar15 = (ulong)uVar9;
          }
LAB_00215572:
          uVar2 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
          if ((uVar2 & 1) == 0) {
            if ((this->fWritePoolBundle != (SRBRoot *)0x0) && (2 < gFormatVersion)) {
              if ((int)uVar9 < 1) {
                uVar15 = 0;
              }
              else {
                pSVar6 = this->fWritePoolBundle->fRoot;
                uVar15 = 0;
                do {
                  lVar3 = *(long *)((long)array + uVar15 * 8);
                  if (*(long *)(lVar3 + 0x78) != 0) goto LAB_00215657;
                  if (*(ushort *)(lVar3 + 0x40) < 0x20) {
                    __assert_fail("!array[i]->fString.isEmpty()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                                  ,0x67f,
                                  "void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
                  }
                  this_00 = (StringBaseResource *)operator_new(0x90);
                  StringBaseResource::StringBaseResource
                            (this_00,this->fWritePoolBundle,'\0',(UnicodeString *)(lVar3 + 0x38),
                             errorCode);
                  (this_00->super_SResource)._vptr_SResource =
                       (_func_int **)&PTR__StringResource_00475598;
                  this_00[1].super_SResource._vptr_SResource = (_func_int **)0x0;
                  this_00[1].super_SResource.fType = '\0';
                  this_00[1].super_SResource.fWritten = '\0';
                  *(undefined2 *)&this_00[1].super_SResource.field_0xa = 0;
                  this_00[1].super_SResource.fRes = 0;
                  *(undefined8 *)((long)&this_00[1].super_SResource.fRes + 1) = 0;
                  (this_00->super_SResource).fNext = *(SResource **)&pSVar6[1].fType;
                  *(StringBaseResource **)&pSVar6[1].fType = this_00;
                  *(int *)&pSVar6[1]._vptr_SResource = *(int *)&pSVar6[1]._vptr_SResource + 1;
                  uVar15 = uVar15 + 1;
                } while (uVar19 != uVar15);
                uVar15 = (ulong)uVar9;
              }
            }
LAB_00215657:
            if ((int)uVar15 < (int)uVar9) {
              iVar10 = this->fPoolStringIndexLimit;
              iVar18 = this->fLocalStringIndexLimit;
              plVar13 = (long *)((long)array + (uVar15 & 0xffffffff) * 8);
              do {
                lVar3 = *plVar13;
                if (*(char *)(lVar3 + 9) == '\0') {
                  if (*(short *)(lVar3 + 0x40) < 0) {
                    iVar17 = *(int *)(lVar3 + 0x44);
                  }
                  else {
                    iVar17 = (int)*(short *)(lVar3 + 0x40) >> 5;
                  }
                  lVar22 = *(long *)(lVar3 + 0x78);
                  if (*(short *)(lVar22 + 0x40) < 0) {
                    iVar20 = *(int *)(lVar22 + 0x44);
                  }
                  else {
                    iVar20 = (int)*(short *)(lVar22 + 0x40) >> 5;
                  }
                  if (iVar17 == iVar20) {
                    __assert_fail("res->length() != same->length()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                                  ,0x690,
                                  "void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
                  }
                  uVar16 = (int)*(char *)(lVar22 + 0x8c) + *(int *)(lVar22 + 0xc) +
                           *(int *)(lVar3 + 0x80);
                  *(uint *)(lVar3 + 0xc) = uVar16;
                  iVar17 = (uVar16 & 0xfffffff) - iVar10;
                  if (iVar17 < 0) {
                    __assert_fail("localStringIndex >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                                  ,0x694,
                                  "void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
                  }
                  if (iVar18 <= iVar17) {
                    iVar18 = iVar17 + 1;
                    this->fLocalStringIndexLimit = iVar18;
                  }
                  *(undefined1 *)(lVar3 + 9) = 1;
                }
                plVar13 = plVar13 + 1;
                uVar16 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar16;
              } while ((int)uVar16 < (int)uVar9);
            }
          }
          else {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          if ((uVar2 & 1) != 0) goto LAB_0021571c;
        }
        else {
          if ((int)uVar9 < 1) {
            uVar9 = 0;
            uVar21 = 0;
            uVar16 = 0;
          }
          else {
            local_38 = &this->f16BitUnits;
            uVar15 = 0;
            uVar16 = 0;
            uVar21 = 0;
            uVar9 = 0;
            do {
              sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar10 = (this->f16BitUnits).fUnion.fFields.fLength;
              }
              else {
                iVar10 = (int)sVar1 >> 5;
              }
              pSVar5 = *(StringResource **)((long)array + uVar15 * 8);
              sVar1 = (pSVar5->super_StringBaseResource).fString.fUnion.fStackFields.fLengthAndFlags
              ;
              if (sVar1 < 0) {
                iVar12 = (pSVar5->super_StringBaseResource).fString.fUnion.fFields.fLength;
              }
              else {
                iVar12 = (int)sVar1 >> 5;
              }
              if ((pSVar5->fNumUnitsSaved < 10) ||
                 (0xfffffff < iVar10 + pSVar5->fNumCharsForLength + iVar12)) {
                uVar9 = uVar9 + pSVar5->fNumUnitsSaved;
                (pSVar5->super_StringBaseResource).super_SResource.fRes = 0;
                (pSVar5->super_StringBaseResource).super_SResource.fWritten = '\x01';
              }
              else {
                StringResource::writeUTF16v2(pSVar5,0,local_38);
                uVar16 = uVar16 + 1;
                uVar21 = uVar21 + pSVar5->fNumUnitsSaved;
              }
              uVar15 = uVar15 + 1;
            } while (uVar19 != uVar15);
          }
          if ((undefined1  [56])
              ((undefined1  [56])(this->f16BitUnits).fUnion & (undefined1  [56])0x1) !=
              (undefined1  [56])0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          UVar8 = getShowWarning();
          if (UVar8 != '\0') {
            printf("number of shared strings: %d\n",(ulong)uVar16);
            sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              uVar16 = (this->f16BitUnits).fUnion.fFields.fLength;
            }
            else {
              uVar16 = (int)sVar1 >> 5;
            }
            printf("16-bit units for strings: %6d = %6d bytes\n",(ulong)uVar16,(ulong)(uVar16 * 2));
            printf("16-bit units saved:       %6d = %6d bytes\n",(ulong)uVar21,(ulong)(uVar21 * 2));
            printf("16-bit units not saved:   %6d = %6d bytes\n",(ulong)uVar9,(ulong)(uVar9 * 2));
          }
        }
        sVar1 = (this->f16BitUnits).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar10 = (this->f16BitUnits).fUnion.fFields.fLength;
        }
        else {
          iVar10 = (int)sVar1 >> 5;
        }
        if (this->f16BitStringsLength + 1 < iVar10) {
          __assert_fail("f16BitUnits.length() <= (f16BitStringsLength + 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/genrb/reslist.cpp"
                        ,0x69c,"void SRBRoot::compactStringsV2(UHashtable *, UErrorCode &)");
        }
      }
    }
  }
LAB_0021571c:
  operator_delete__(array);
  return;
}

Assistant:

void
TableResource::handlePreWrite(uint32_t *byteOffset) {
    preWriteAllRes(byteOffset);
    if (fTableType == URES_TABLE) {
        /* 16-bit count, 16-bit key offsets, 32-bit values */
        fRes = URES_MAKE_RESOURCE(URES_TABLE, *byteOffset >> 2);
        *byteOffset += 2 + fCount * 6;
    } else {
        /* 32-bit count, key offsets and values */
        fRes = URES_MAKE_RESOURCE(URES_TABLE32, *byteOffset >> 2);
        *byteOffset += 4 + fCount * 8;
    }
}